

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varinfo.c
# Opt level: O3

int varinfo_set_feature(varinfo *info,char *feature)

{
  int iVar1;
  undefined8 in_RAX;
  int data;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  iVar1 = symtab_get_t(info->data->symtab,feature,0,&local_14);
  if (iVar1 == -1) {
    fprintf(_stderr,"no feature %s\n",feature);
  }
  else {
    iVar1 = mask_intersect(info->data->features[local_14].cfmask,info->fmask,info->data->featuresnum
                          );
    if (iVar1 == -1) {
      mask_or(info->fmask,info->data->features[local_14].ifmask,info->data->featuresnum);
      return 0;
    }
    varinfo_set_feature_cold_1();
  }
  return -1;
}

Assistant:

int varinfo_set_feature(struct varinfo *info, const char *feature) {
	int data;
	if (symtab_get_t(info->data->symtab, feature, VARDATA_ST_FEATURE, &data) == -1) {
		fprintf(stderr, "no feature %s\n", feature);
		return -1;
	}
	int cf;
	if ((cf = mask_intersect(info->data->features[data].cfmask, info->fmask, info->data->featuresnum)) != -1) {
		fprintf(stderr, "feature %s conflicts with already set feature %s\n", info->data->features[data].name, info->data->features[cf].name);
		return -1;
	}
	mask_or(info->fmask, info->data->features[data].ifmask, info->data->featuresnum);
	return 0;
}